

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBondRvol.cpp
# Opt level: O1

void __thiscall OpenMD::HBondRvol::process(HBondRvol *this)

{
  double *pdVar1;
  int *piVar2;
  pointer pdVar3;
  double dVar4;
  uint i;
  int iVar5;
  Molecule *this_00;
  Molecule *pMVar6;
  HBondDonor *pHVar7;
  Atom *pAVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  pointer ppAVar12;
  pointer ppHVar13;
  long lVar14;
  double tmp;
  double tmp_2;
  double dVar15;
  Vector3d mPos;
  Vector3d DH;
  int jj;
  int ii;
  Vector3d DA;
  Vector3d hPos;
  Vector3d dPos;
  Vector3d aPos;
  DumpReader reader;
  double local_13a8 [4];
  double local_1388;
  SelectionSet local_1380;
  Vector3d local_1368;
  int local_1344;
  int local_1340;
  int local_133c;
  Vector3d local_1338;
  double local_1318 [4];
  double local_12f8 [4];
  SelectionManager *local_12d8;
  SelectionManager *local_12d0;
  double local_12c8 [3];
  SelectionEvaluator *local_12b0;
  SelectionEvaluator *local_12a8;
  SelectionEvaluator *local_12a0;
  ulong local_1298;
  Molecule *local_1290;
  DumpReader local_1288;
  
  local_12f8[0] = 0.0;
  local_12f8[1] = 0.0;
  local_12f8[2] = 0.0;
  local_12c8[2] = 0.0;
  local_12c8[0] = 0.0;
  local_12c8[1] = 0.0;
  local_1318[2] = 0.0;
  local_1318[0] = 0.0;
  local_1318[1] = 0.0;
  local_1368.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1368.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1368.super_Vector<double,_3U>.data_[1] = 0.0;
  local_1338.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1338.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1338.super_Vector<double,_3U>.data_[1] = 0.0;
  DumpReader::DumpReader
            (&local_1288,(this->super_StaticAnalyser).info_,
             &(this->super_StaticAnalyser).dumpFilename_);
  local_1344 = DumpReader::getNFrames(&local_1288);
  this->frameCounter_ = 0;
  if (0 < local_1344) {
    local_12a0 = &this->evaluator1_;
    local_12a8 = &this->evaluator2_;
    local_12b0 = &this->evaluator3_;
    local_12d8 = &this->seleMan1_;
    local_12d0 = &this->seleMan2_;
    uVar11 = 0;
    do {
      local_1298 = uVar11;
      DumpReader::readFrame(&local_1288,(int)uVar11);
      this->currentSnapshot_ = ((this->super_StaticAnalyser).info_)->sman_->currentSnapshot_;
      if ((this->evaluator1_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1380,local_12a0);
        lVar14 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan1_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_> + lVar14),
                     (vector<bool,_std::allocator<bool>_> *)
                     ((long)&((local_1380.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar14));
          lVar14 = lVar14 + 0x28;
        } while (lVar14 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1380.bitsets_);
      }
      if ((this->evaluator2_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1380,local_12a8);
        lVar14 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan2_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_> + lVar14),
                     (vector<bool,_std::allocator<bool>_> *)
                     ((long)&((local_1380.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar14));
          lVar14 = lVar14 + 0x28;
        } while (lVar14 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1380.bitsets_);
      }
      if ((this->evaluator3_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_1380,local_12b0);
        lVar14 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan3_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_> + lVar14),
                     (vector<bool,_std::allocator<bool>_> *)
                     ((long)&((local_1380.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                     lVar14));
          lVar14 = lVar14 + 0x28;
        } while (lVar14 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_1380.bitsets_);
      }
      this_00 = SelectionManager::beginSelectedMolecule(local_12d8,&local_133c);
      while (this_00 != (Molecule *)0x0) {
        Molecule::getCom((Vector3d *)&local_1380,this_00);
        pMVar6 = SelectionManager::beginSelectedMolecule(local_12d0,&local_1340);
        local_1290 = this_00;
        while (pMVar6 != (Molecule *)0x0) {
          ppHVar13 = (this_00->hBondDonors_).
                     super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          while( true ) {
            if (ppHVar13 ==
                (this_00->hBondDonors_).
                super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              pHVar7 = (HBondDonor *)0x0;
            }
            else {
              pHVar7 = *ppHVar13;
            }
            if (pHVar7 == (HBondDonor *)0x0) break;
            pAVar8 = pHVar7->donorAtom;
            lVar14 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar8->super_StuntDouble).storage_);
            lVar9 = (long)(pAVar8->super_StuntDouble).localIndex_;
            local_12f8[2] = (double)*(undefined8 *)(lVar14 + 0x10 + lVar9 * 0x18);
            pdVar1 = (double *)(lVar14 + lVar9 * 0x18);
            local_12f8[0] = *pdVar1;
            local_12f8[1] = pdVar1[1];
            pAVar8 = pHVar7->donatedHydrogen;
            lVar14 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar8->super_StuntDouble).storage_);
            lVar9 = (long)(pAVar8->super_StuntDouble).localIndex_;
            local_1318[2] = (double)*(undefined8 *)(lVar14 + 0x10 + lVar9 * 0x18);
            pdVar1 = (double *)(lVar14 + lVar9 * 0x18);
            local_1318[0] = *pdVar1;
            local_1318[1] = pdVar1[1];
            local_13a8[0] = 0.0;
            local_13a8[1] = 0.0;
            local_13a8[2] = 0.0;
            lVar14 = 0;
            do {
              local_13a8[lVar14] = local_1318[lVar14] - local_12f8[lVar14];
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            local_1368.super_Vector<double,_3U>.data_[2] = local_13a8[2];
            local_1368.super_Vector<double,_3U>.data_[0] = local_13a8[0];
            local_1368.super_Vector<double,_3U>.data_[1] = local_13a8[1];
            Snapshot::wrapVector(this->currentSnapshot_,&local_1368);
            dVar4 = 0.0;
            lVar14 = 0;
            do {
              dVar15 = local_1368.super_Vector<double,_3U>.data_[lVar14];
              dVar4 = dVar4 + dVar15 * dVar15;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 3);
            if (dVar4 < 0.0) {
              local_1388 = sqrt(dVar4);
            }
            else {
              local_1388 = SQRT(dVar4);
            }
            ppAVar12 = (pMVar6->hBondAcceptors_).
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start;
            while( true ) {
              if (ppAVar12 ==
                  (pMVar6->hBondAcceptors_).
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                pAVar8 = (Atom *)0x0;
              }
              else {
                pAVar8 = *ppAVar12;
              }
              if (pAVar8 == (Atom *)0x0) break;
              lVar14 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (pAVar8->super_StuntDouble).storage_);
              lVar9 = (long)(pAVar8->super_StuntDouble).localIndex_;
              local_12c8[2] = (double)*(undefined8 *)(lVar14 + 0x10 + lVar9 * 0x18);
              pdVar1 = (double *)(lVar14 + lVar9 * 0x18);
              local_12c8[0] = *pdVar1;
              local_12c8[1] = pdVar1[1];
              local_13a8[0] = 0.0;
              local_13a8[1] = 0.0;
              local_13a8[2] = 0.0;
              lVar14 = 0;
              do {
                local_13a8[lVar14] = local_12c8[lVar14] - local_12f8[lVar14];
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              local_1338.super_Vector<double,_3U>.data_[2] = local_13a8[2];
              local_1338.super_Vector<double,_3U>.data_[0] = local_13a8[0];
              local_1338.super_Vector<double,_3U>.data_[1] = local_13a8[1];
              Snapshot::wrapVector(this->currentSnapshot_,&local_1338);
              dVar4 = 0.0;
              lVar14 = 0;
              do {
                dVar15 = local_1338.super_Vector<double,_3U>.data_[lVar14];
                dVar4 = dVar4 + dVar15 * dVar15;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              if (dVar4 < 0.0) {
                dVar4 = sqrt(dVar4);
              }
              else {
                dVar4 = SQRT(dVar4);
              }
              if (dVar4 < this->rCut_) {
                dVar15 = 0.0;
                lVar14 = 0;
                do {
                  dVar15 = dVar15 + local_1368.super_Vector<double,_3U>.data_[lVar14] *
                                    local_1338.super_Vector<double,_3U>.data_[lVar14];
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                dVar4 = acos(dVar15 / (dVar4 * local_1388));
                if ((dVar4 * 180.0) / 3.141592653589793 < this->thetaCut_) {
                  dVar4 = 0.0;
                  lVar14 = 0;
                  do {
                    dVar4 = dVar4 + local_1318[lVar14] * local_1318[lVar14];
                    lVar14 = lVar14 + 1;
                  } while (lVar14 != 3);
                  if (dVar4 < 0.0) {
                    dVar4 = sqrt(dVar4);
                  }
                  else {
                    dVar4 = SQRT(dVar4);
                  }
                  iVar5 = (int)(dVar4 / this->deltaR_);
                  pdVar3 = (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar3[iVar5] = pdVar3[iVar5] + 1.0;
                  piVar2 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start + iVar5;
                  *piVar2 = *piVar2 + 1;
                }
              }
              ppAVar12 = ppAVar12 + 1;
            }
            ppHVar13 = ppHVar13 + 1;
          }
          ppAVar12 = (this_00->hBondAcceptors_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          while( true ) {
            if (ppAVar12 ==
                (this_00->hBondAcceptors_).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              pAVar8 = (Atom *)0x0;
            }
            else {
              pAVar8 = *ppAVar12;
            }
            if (pAVar8 == (Atom *)0x0) break;
            lVar14 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->currentSnapshot_
                                      ->atomData).position.
                                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                              (pAVar8->super_StuntDouble).storage_);
            lVar9 = (long)(pAVar8->super_StuntDouble).localIndex_;
            local_12c8[2] = (double)*(undefined8 *)(lVar14 + 0x10 + lVar9 * 0x18);
            pdVar1 = (double *)(lVar14 + lVar9 * 0x18);
            local_12c8[0] = *pdVar1;
            local_12c8[1] = pdVar1[1];
            ppHVar13 = (pMVar6->hBondDonors_).
                       super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            while( true ) {
              if (ppHVar13 ==
                  (pMVar6->hBondDonors_).
                  super__Vector_base<OpenMD::Molecule::HBondDonor_*,_std::allocator<OpenMD::Molecule::HBondDonor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                pHVar7 = (HBondDonor *)0x0;
              }
              else {
                pHVar7 = *ppHVar13;
              }
              if (pHVar7 == (HBondDonor *)0x0) break;
              pAVar8 = pHVar7->donorAtom;
              lVar14 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->
                                         currentSnapshot_->atomData).position.
                                        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start +
                                (pAVar8->super_StuntDouble).storage_);
              lVar9 = (long)(pAVar8->super_StuntDouble).localIndex_;
              local_12f8[2] = (double)*(undefined8 *)(lVar14 + 0x10 + lVar9 * 0x18);
              pdVar1 = (double *)(lVar14 + lVar9 * 0x18);
              local_12f8[0] = *pdVar1;
              local_12f8[1] = pdVar1[1];
              local_13a8[0] = 0.0;
              local_13a8[1] = 0.0;
              local_13a8[2] = 0.0;
              lVar14 = 0;
              do {
                local_13a8[lVar14] = local_12c8[lVar14] - local_12f8[lVar14];
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              local_1338.super_Vector<double,_3U>.data_[2] = local_13a8[2];
              local_1338.super_Vector<double,_3U>.data_[0] = local_13a8[0];
              local_1338.super_Vector<double,_3U>.data_[1] = local_13a8[1];
              Snapshot::wrapVector(this->currentSnapshot_,&local_1338);
              dVar4 = 0.0;
              lVar14 = 0;
              do {
                dVar15 = local_1338.super_Vector<double,_3U>.data_[lVar14];
                dVar4 = dVar4 + dVar15 * dVar15;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 3);
              if (dVar4 < 0.0) {
                dVar4 = sqrt(dVar4);
              }
              else {
                dVar4 = SQRT(dVar4);
              }
              if (dVar4 < this->rCut_) {
                pAVar8 = pHVar7->donatedHydrogen;
                lVar14 = *(long *)((long)&(((pAVar8->super_StuntDouble).snapshotMan_)->
                                           currentSnapshot_->atomData).position.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  (pAVar8->super_StuntDouble).storage_);
                lVar9 = (long)(pAVar8->super_StuntDouble).localIndex_;
                local_1318[2] = (double)*(undefined8 *)(lVar14 + 0x10 + lVar9 * 0x18);
                pdVar1 = (double *)(lVar14 + lVar9 * 0x18);
                local_1318[0] = *pdVar1;
                local_1318[1] = pdVar1[1];
                local_13a8[0] = 0.0;
                local_13a8[1] = 0.0;
                local_13a8[2] = 0.0;
                lVar14 = 0;
                do {
                  local_13a8[lVar14] = local_1318[lVar14] - local_12f8[lVar14];
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                local_1368.super_Vector<double,_3U>.data_[2] = local_13a8[2];
                local_1368.super_Vector<double,_3U>.data_[0] = local_13a8[0];
                local_1368.super_Vector<double,_3U>.data_[1] = local_13a8[1];
                local_1388 = dVar4;
                Snapshot::wrapVector(this->currentSnapshot_,&local_1368);
                dVar4 = 0.0;
                lVar14 = 0;
                do {
                  dVar15 = local_1368.super_Vector<double,_3U>.data_[lVar14];
                  dVar4 = dVar4 + dVar15 * dVar15;
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                if (dVar4 < 0.0) {
                  dVar4 = sqrt(dVar4);
                }
                else {
                  dVar4 = SQRT(dVar4);
                }
                dVar15 = 0.0;
                lVar14 = 0;
                do {
                  dVar15 = dVar15 + local_1368.super_Vector<double,_3U>.data_[lVar14] *
                                    local_1338.super_Vector<double,_3U>.data_[lVar14];
                  lVar14 = lVar14 + 1;
                } while (lVar14 != 3);
                dVar4 = acos(dVar15 / (local_1388 * dVar4));
                if ((dVar4 * 180.0) / 3.141592653589793 < this->thetaCut_) {
                  dVar4 = 0.0;
                  lVar14 = 0;
                  do {
                    dVar4 = dVar4 + local_1318[lVar14] * local_1318[lVar14];
                    lVar14 = lVar14 + 1;
                  } while (lVar14 != 3);
                  if (dVar4 < 0.0) {
                    dVar4 = sqrt(dVar4);
                  }
                  else {
                    dVar4 = SQRT(dVar4);
                  }
                  iVar5 = (int)(dVar4 / this->deltaR_);
                  pdVar3 = (this->sliceQ_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                  pdVar3[iVar5] = pdVar3[iVar5] + 1.0;
                  piVar2 = (this->sliceCount_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                           .super__Vector_impl_data._M_start + iVar5;
                  *piVar2 = *piVar2 + 1;
                }
              }
              ppHVar13 = ppHVar13 + 1;
            }
            ppAVar12 = ppAVar12 + 1;
            this_00 = local_1290;
          }
          pMVar6 = SelectionManager::nextSelectedMolecule(local_12d0,&local_1340);
        }
        this_00 = SelectionManager::nextSelectedMolecule(local_12d8,&local_133c);
      }
      writeDensityR(this);
      uVar10 = (int)local_1298 + (this->super_StaticAnalyser).step_;
      uVar11 = (ulong)uVar10;
    } while ((int)uVar10 < local_1344);
  }
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void HBondRvol::process() {
    Molecule* mol1;
    Molecule* mol2;
    Molecule* mol3;
    Molecule::HBondDonor* hbd1;
    Molecule::HBondDonor* hbd2;
    std::vector<Molecule::HBondDonor*>::iterator hbdi;
    std::vector<Molecule::HBondDonor*>::iterator hbdj;
    std::vector<Atom*>::iterator hbai;
    std::vector<Atom*>::iterator hbaj;

    RealType r;

    Atom* hba1;
    Atom* hba2;
    Vector3d dPos;
    Vector3d aPos;
    Vector3d hPos;
    Vector3d DH;
    Vector3d DA;
    RealType DAdist, DHdist, theta, ctheta;
    int ii, jj;
    int nHB, nA, nD;

    DumpReader reader(info_, dumpFilename_);
    int nFrames   = reader.getNFrames();
    frameCounter_ = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }

      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
      }

      if (evaluator3_.isDynamic()) {
        seleMan3_.setSelectionSet(evaluator3_.evaluate());
      }

      for (mol1 = seleMan1_.beginSelectedMolecule(ii); mol1 != NULL;
           mol1 = seleMan1_.nextSelectedMolecule(ii)) {
        // We're collecting statistics on the molecules in selection 1:
        nHB           = 0;
        nA            = 0;
        nD            = 0;
        Vector3d mPos = mol1->getCom();

        for (mol2 = seleMan2_.beginSelectedMolecule(jj); mol2 != NULL;
             mol2 = seleMan2_.nextSelectedMolecule(jj)) {
          // loop over the possible donors in molecule 1:
          for (hbd1 = mol1->beginHBondDonor(hbdi); hbd1 != NULL;
               hbd1 = mol1->nextHBondDonor(hbdi)) {
            dPos = hbd1->donorAtom->getPos();
            hPos = hbd1->donatedHydrogen->getPos();
            DH   = hPos - dPos;
            currentSnapshot_->wrapVector(DH);
            DHdist = DH.length();

            // loop over the possible acceptors in molecule 2:
            for (hba2 = mol2->beginHBondAcceptor(hbaj); hba2 != NULL;
                 hba2 = mol2->nextHBondAcceptor(hbaj)) {
              aPos = hba2->getPos();
              DA   = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < rCut_) {
                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;

                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_) {
                  // molecule 1 is a Hbond donor:
                  nHB++;
                  nD++;
                  r         = hPos.length();
                  int binNo = int(r / deltaR_);
                  sliceQ_[binNo] += 1;
                  sliceCount_[binNo] += 1;
                }
              }
            }
          }

          // now loop over the possible acceptors in molecule 1:
          for (hba1 = mol1->beginHBondAcceptor(hbai); hba1 != NULL;
               hba1 = mol1->nextHBondAcceptor(hbai)) {
            aPos = hba1->getPos();

            // loop over the possible donors in molecule 2:
            for (hbd2 = mol2->beginHBondDonor(hbdj); hbd2 != NULL;
                 hbd2 = mol2->nextHBondDonor(hbdj)) {
              dPos = hbd2->donorAtom->getPos();

              DA = aPos - dPos;
              currentSnapshot_->wrapVector(DA);
              DAdist = DA.length();

              // Distance criteria: are the donor and acceptor atoms
              // close enough?
              if (DAdist < rCut_) {
                hPos = hbd2->donatedHydrogen->getPos();
                DH   = hPos - dPos;
                currentSnapshot_->wrapVector(DH);
                DHdist = DH.length();
                ctheta = dot(DH, DA) / (DHdist * DAdist);
                theta  = acos(ctheta) * 180.0 / Constants::PI;
                // Angle criteria: are the D-H and D-A and vectors close?
                if (theta < thetaCut_) {
                  // molecule 1 is a Hbond acceptor:
                  nHB++;
                  nA++;
                  r         = hPos.length();
                  int binNo = int(r / deltaR_);
                  sliceQ_[binNo] += 1;
                  sliceCount_[binNo] += 1;
                }
              }
            }
          }
        }
      }
      writeDensityR();
    }
  }